

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O2

void NULLCDynamic::OverrideFunction(NULLCRef dest,NULLCRef src)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  FastVector<char,_false,_false> *pFVar4;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/dynamic.cpp"
                  ,0xf,"void NULLCDynamic::OverrideFunction(NULLCRef, NULLCRef)");
  }
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
  if (pEVar1->subCat == CAT_FUNCTION) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),src.typeID);
    if (pEVar1->subCat == CAT_FUNCTION) {
      if (dest.typeID == src.typeID) {
        nullcRedirectFunction(*(uint *)(dest.ptr + 8),*(uint *)(src.ptr + 8));
        return;
      }
      pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),src.typeID);
      pcVar2 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
      pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
      pcVar3 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
      nullcThrowError("Cannot convert from \'%s\' to \'%s\'",pcVar2,pcVar3);
      return;
    }
    pcVar2 = "Source variable is not a function";
  }
  else {
    pcVar2 = "Destination variable is not a function";
  }
  nullcThrowError(pcVar2);
  return;
}

Assistant:

void OverrideFunction(NULLCRef dest, NULLCRef src)
	{
		assert(linker);
		if(linker->exTypes[dest.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Destination variable is not a function");
			return;
		}
		if(linker->exTypes[src.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Source variable is not a function");
			return;
		}
		if(dest.typeID != src.typeID)
		{
			nullcThrowError("Cannot convert from '%s' to '%s'", &linker->exSymbols[linker->exTypes[src.typeID].offsetToName], &linker->exSymbols[linker->exTypes[dest.typeID].offsetToName]);
			return;
		}

		nullcRedirectFunction(((NULLCFuncPtr*)dest.ptr)->id, ((NULLCFuncPtr*)src.ptr)->id);
	}